

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pipeline_layout
          (Impl *this,VkPipelineLayoutCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipelineLayoutCreateInfo **out_create_info)

{
  void *pvVar1;
  VkPipelineLayoutCreateInfo *pVVar2;
  VkPushConstantRange *pVVar3;
  VkDescriptorSetLayout_T **ppVVar4;
  
  pvVar1 = create_info->pNext;
  if (pvVar1 == (void *)0x0) {
    pVVar2 = copy<VkPipelineLayoutCreateInfo>(this,create_info,1,alloc);
    pVVar3 = copy<VkPushConstantRange>
                       (this,pVVar2->pPushConstantRanges,(ulong)pVVar2->pushConstantRangeCount,alloc
                       );
    pVVar2->pPushConstantRanges = pVVar3;
    ppVVar4 = copy<VkDescriptorSetLayout_T*>
                        (this,pVVar2->pSetLayouts,(ulong)pVVar2->setLayoutCount,alloc);
    pVVar2->pSetLayouts = ppVVar4;
    *out_create_info = pVVar2;
  }
  return pvVar1 == (void *)0x0;
}

Assistant:

bool StateRecorder::Impl::copy_pipeline_layout(const VkPipelineLayoutCreateInfo *create_info, ScratchAllocator &alloc,
                                               VkPipelineLayoutCreateInfo **out_create_info)
{
	if (create_info->pNext)
		return false;

	auto *info = copy(create_info, 1, alloc);
	info->pPushConstantRanges = copy(info->pPushConstantRanges, info->pushConstantRangeCount, alloc);
	info->pSetLayouts = copy(info->pSetLayouts, info->setLayoutCount, alloc);

	*out_create_info = info;
	return true;
}